

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

IterateResult __thiscall gl3cts::TransformFeedback::DrawXFBFeedback::iterate(DrawXFBFeedback *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  ContextType ctxType;
  char *description;
  TestContext *this_00;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x104);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_transform_feedback2");
  if ((bVar2) || (bVar3)) {
    prepareAndBind(this);
    draw(this,true);
    swapBuffers(this);
    draw(this,false);
    swapBuffers(this);
    draw(this,false);
    bVar2 = check(this);
  }
  else {
    bVar2 = true;
  }
  clean(this);
  if (bVar2 == false) {
    local_198._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Draw XFB Feedback have failed.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_120);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
  }
  else {
    local_198._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Draw XFB Feedback have passed.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_120);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_00,(uint)(bVar2 == false),description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::DrawXFBFeedback::iterate(void)
{
	/* Initializations. */
	bool is_at_least_gl_40 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_arb_tf_2	   = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback2");

	bool is_ok		= true;
	bool test_error = false;

	/* Tests. */
	try
	{
		if (is_at_least_gl_40 || is_arb_tf_2)
		{
			prepareAndBind();
			draw(true);
			swapBuffers();
			draw(false);
			swapBuffers();
			draw(false);

			is_ok = is_ok && check();
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean GL objects. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Feedback have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Feedback have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Feedback have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}